

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2_test.c
# Opt level: O0

void iep2_test(iep2_test_cfg *cfg)

{
  undefined2 uVar1;
  int iVar2;
  RK_S32 fd;
  RK_S32 fd_00;
  iep_com_ctx *ctx;
  size_t __n;
  size_t __n_00;
  long lVar3;
  void *__ptr;
  void *__s;
  size_t sVar4;
  long lStack_1a0;
  MPP_RET ret;
  MppBufferGroup memGroup;
  IepImg imgdst [2];
  IepImg imgsrc [3];
  iep2_api_info dei_info;
  DataCrc checkcrc;
  RK_S32 out_order;
  RK_S32 field_order;
  RK_U32 i;
  iep2_api_params params;
  int next;
  int curr;
  int prev;
  RK_S32 fddst [2];
  RK_S32 fdsrc [3];
  RK_U8 *pdst [2];
  RK_U8 *psrc [3];
  long local_58;
  MppBuffer dstbuf [2];
  MppBuffer srcbuf [3];
  size_t dstfrmsize;
  size_t srcfrmsize;
  iep_com_ctx *iep2;
  iep2_test_cfg *cfg_local;
  
  ctx = (iep_com_ctx *)rockchip_iep2_api_alloc_ctx();
  __n = get_frm_size(cfg->src_fmt,cfg->w,cfg->h);
  __n_00 = get_frm_size(cfg->dst_fmt,cfg->w,cfg->h);
  checkcrc._20_4_ = 0;
  if ((ctx == (iep_com_ctx *)0x0) &&
     (_mpp_log_l(2,"iep2_test","Assertion %s failed at %s:%d\n",0,"iep2","iep2_test",0xdc),
     (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  iVar2 = mpp_buffer_group_get(&stack0xfffffffffffffe60,3,0,"iep2_test");
  if (iVar2 != 0) {
    _mpp_log_l(2,"iep2_test","memGroup mpp_buffer_group_get failed\n",0);
    _mpp_log_l(2,"iep2_test","Assertion %s failed at %s:%d\n",0,"0","iep2_test",0xe1);
    if ((_mpp_debug & 0x10000000) != 0) {
      abort();
    }
  }
  memset(&dei_info.pd_flag,0,0x18);
  lVar3 = mpp_osal_malloc("iep2_test",0x1000);
  mpp_buffer_get_with_tag(lStack_1a0,dstbuf + 1,__n,"iep2_test");
  mpp_buffer_get_with_tag(lStack_1a0,srcbuf,__n,"iep2_test");
  mpp_buffer_get_with_tag(lStack_1a0,srcbuf + 1,__n,"iep2_test");
  mpp_buffer_get_with_tag(lStack_1a0,&local_58,__n_00,"iep2_test");
  mpp_buffer_get_with_tag(lStack_1a0,dstbuf,__n_00,"iep2_test");
  if (((((dstbuf[1] == (MppBuffer)0x0) || (srcbuf[0] == (MppBuffer)0x0)) ||
       (srcbuf[1] == (MppBuffer)0x0)) || ((local_58 == 0 || (dstbuf[0] == (MppBuffer)0x0)))) &&
     (_mpp_log_l(2,"iep2_test","Assertion %s failed at %s:%d\n",0,
                 "srcbuf[0] && srcbuf[1] && srcbuf[2] && dstbuf[0] && dstbuf[1]","iep2_test",0xec),
     (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  pdst[1] = (RK_U8 *)mpp_buffer_get_ptr_with_caller(dstbuf[1],"iep2_test");
  __ptr = (void *)mpp_buffer_get_ptr_with_caller(srcbuf[0],"iep2_test");
  mpp_buffer_get_ptr_with_caller(srcbuf[1],"iep2_test");
  __s = (void *)mpp_buffer_get_ptr_with_caller(local_58,"iep2_test");
  pdst[0] = (RK_U8 *)mpp_buffer_get_ptr_with_caller(dstbuf[0],"iep2_test");
  fddst[0] = mpp_buffer_get_fd_with_caller(dstbuf[1],"iep2_test");
  fddst[1] = mpp_buffer_get_fd_with_caller(srcbuf[0],"iep2_test");
  mpp_buffer_get_fd_with_caller(srcbuf[1],"iep2_test");
  fd = mpp_buffer_get_fd_with_caller(local_58,"iep2_test");
  fd_00 = mpp_buffer_get_fd_with_caller(dstbuf[0],"iep2_test");
  (*ctx->ops->init)(&ctx->priv);
  sVar4 = fread(pdst[1],1,__n,(FILE *)cfg->fp_src);
  if (sVar4 < __n) {
    _mpp_log_l(4,"iep2_test","source exhaused\n",0);
  }
  else {
    sVar4 = fread(__ptr,1,__n,(FILE *)cfg->fp_src);
    if (sVar4 < __n) {
      _mpp_log_l(4,"iep2_test","source exhaused\n",0);
    }
    else {
      params.param.com.hor_stride = 1;
      field_order = 1;
      i = 1;
      params.ptype = IEP2_PARAM_TYPE_COM;
      params.param.com.sfmt = cfg->field_order;
      (*ctx->ops->control)(ctx->priv,IEP_CMD_SET_DEI_CFG,&field_order);
      field_order = 0;
      i = cfg->src_fmt;
      params.param.com.sfmt = cfg->dst_fmt;
      params.ptype = cfg->src_swa;
      params.param.com.sswap = cfg->dst_swa;
      params.param.com.dfmt = cfg->w;
      params.param.com.dswap = cfg->h;
      params.param.com.width = cfg->w;
      (*ctx->ops->control)(ctx->priv,IEP_CMD_SET_DEI_CFG,&field_order);
      for (out_order = 0; (uint)out_order < 3; out_order = out_order + 1) {
        uVar1 = *(undefined2 *)((long)&cfg->src_fmt + 2);
        imgsrc[(uint)out_order].x_off = *(undefined2 *)&cfg->src_fmt;
        imgsrc[(uint)out_order].y_off = uVar1;
      }
      for (out_order = 0; (uint)out_order < 2; out_order = out_order + 1) {
        uVar1 = *(undefined2 *)((long)&cfg->dst_fmt + 2);
        imgdst[(uint)out_order].x_off = *(undefined2 *)&cfg->dst_fmt;
        imgdst[(uint)out_order].y_off = uVar1;
      }
      while( true ) {
        iVar2 = (params.param.com.hor_stride + -1) % 3;
        params.param.com.hor_stride = params.param.com.hor_stride % 3;
        params.param.com.height = (params.param.com.hor_stride + 1) % 3;
        sVar4 = fread(pdst[(long)params.param.com.height + 1],1,__n,(FILE *)cfg->fp_src);
        if (sVar4 < __n) break;
        iep2_test_set_img(ctx,cfg->w,cfg->h,
                          (IepImg *)&imgsrc[(long)params.param.com.hor_stride + -1].uv_addr,
                          fddst[params.param.com.hor_stride],IEP_CMD_SET_SRC);
        iep2_test_set_img(ctx,cfg->w,cfg->h,
                          (IepImg *)&imgsrc[(long)params.param.com.height + -1].uv_addr,
                          fddst[params.param.com.height],IEP_CMD_SET_DEI_SRC1);
        iep2_test_set_img(ctx,cfg->w,cfg->h,(IepImg *)&imgsrc[(long)iVar2 + -1].uv_addr,fddst[iVar2]
                          ,IEP_CMD_SET_DEI_SRC2);
        iep2_test_set_img(ctx,cfg->w,cfg->h,(IepImg *)&memGroup,fd,IEP_CMD_SET_DST);
        iep2_test_set_img(ctx,cfg->w,cfg->h,(IepImg *)&imgdst[0].uv_addr,fd_00,IEP_CMD_SET_DEI_DST1)
        ;
        memset(__s,0,__n_00);
        memset(pdst[0],0,__n_00);
        (*ctx->ops->control)(ctx->priv,IEP_CMD_RUN_SYNC,&imgsrc[2].uv_addr);
        if (cfg->fp_slt != (FILE *)0x0) {
          calc_data_crc(pdst[(long)(int)checkcrc._20_4_ + -1],(RK_U32)__n_00,
                        (DataCrc *)&dei_info.pd_flag);
          write_data_crc(cfg->fp_slt,(DataCrc *)&dei_info.pd_flag);
          calc_data_crc(pdst[(long)(1 - checkcrc._20_4_) + -1],(RK_U32)__n_00,
                        (DataCrc *)&dei_info.pd_flag);
          write_data_crc(cfg->fp_slt,(DataCrc *)&dei_info.pd_flag);
        }
        checkcrc._20_4_ = ZEXT14(imgsrc[2].uv_addr == 1);
        if (cfg->fp_dst != (FILE *)0x0) {
          sVar4 = fwrite(pdst[(long)(int)checkcrc._20_4_ + -1],1,__n_00,(FILE *)cfg->fp_dst);
          if (sVar4 < __n_00) {
            _mpp_log_l(2,"iep2_test","destination dump failed\n",0);
            goto LAB_00102ce5;
          }
          sVar4 = fwrite(pdst[(long)(1 - checkcrc._20_4_) + -1],1,__n_00,(FILE *)cfg->fp_dst);
          if (sVar4 < __n_00) {
            _mpp_log_l(2,"iep2_test","destination dump failed\n",0);
            goto LAB_00102ce5;
          }
        }
        params.param.com.hor_stride = params.param.com.hor_stride + 1;
      }
      _mpp_log_l(4,"iep2_test","source exhaused\n",0);
    }
  }
LAB_00102ce5:
  mpp_buffer_put_with_caller(dstbuf[1],"iep2_test");
  mpp_buffer_put_with_caller(srcbuf[0],"iep2_test");
  mpp_buffer_put_with_caller(srcbuf[1],"iep2_test");
  mpp_buffer_put_with_caller(local_58,"iep2_test");
  mpp_buffer_put_with_caller(dstbuf[0],"iep2_test");
  if (lVar3 != 0) {
    mpp_osal_free("iep2_test",lVar3);
  }
  if (lStack_1a0 != 0) {
    mpp_buffer_group_put(lStack_1a0);
    lStack_1a0 = 0;
  }
  (*ctx->ops->deinit)(ctx->priv);
  rockchip_iep2_api_release_ctx(ctx);
  return;
}

Assistant:

void iep2_test(iep2_test_cfg *cfg)
{
    iep_com_ctx* iep2 = rockchip_iep2_api_alloc_ctx();
    size_t srcfrmsize = get_frm_size(cfg->src_fmt, cfg->w, cfg->h);
    size_t dstfrmsize = get_frm_size(cfg->dst_fmt, cfg->w, cfg->h);
    MppBuffer srcbuf[3];
    MppBuffer dstbuf[2];
    RK_U8 *psrc[3];
    RK_U8 *pdst[2];
    RK_S32 fdsrc[3];
    RK_S32 fddst[2];
    int prev, curr, next;
    struct iep2_api_params params;
    RK_U32 i;
    RK_S32 field_order = IEP2_FIELD_ORDER_TFF;
    RK_S32 out_order = field_order == IEP2_FIELD_ORDER_TFF ? 0 : 1;
    DataCrc checkcrc;
    struct iep2_api_info dei_info;

    // NOTISE, used IepImg structure for version compatibility consideration,
    // only addresses in this structure are useful in iep2
    IepImg imgsrc[3];
    IepImg imgdst[2];

    mpp_assert(iep2);
    MppBufferGroup memGroup;
    MPP_RET ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_DRM);
    if (MPP_OK != ret) {
        mpp_err("memGroup mpp_buffer_group_get failed\n");
        mpp_assert(0);
    }

    memset(&checkcrc, 0, sizeof(checkcrc));
    checkcrc.sum = mpp_malloc(RK_ULONG, 512);

    mpp_buffer_get(memGroup, &srcbuf[0], srcfrmsize);
    mpp_buffer_get(memGroup, &srcbuf[1], srcfrmsize);
    mpp_buffer_get(memGroup, &srcbuf[2], srcfrmsize);
    mpp_buffer_get(memGroup, &dstbuf[0], dstfrmsize);
    mpp_buffer_get(memGroup, &dstbuf[1], dstfrmsize);
    mpp_assert(srcbuf[0] && srcbuf[1] && srcbuf[2] && dstbuf[0] && dstbuf[1]);

    psrc[0] = mpp_buffer_get_ptr(srcbuf[0]);
    psrc[1] = mpp_buffer_get_ptr(srcbuf[1]);
    psrc[2] = mpp_buffer_get_ptr(srcbuf[2]);

    pdst[0] = mpp_buffer_get_ptr(dstbuf[0]);
    pdst[1] = mpp_buffer_get_ptr(dstbuf[1]);

    fdsrc[0] = mpp_buffer_get_fd(srcbuf[0]);
    fdsrc[1] = mpp_buffer_get_fd(srcbuf[1]);
    fdsrc[2] = mpp_buffer_get_fd(srcbuf[2]);

    fddst[0] = mpp_buffer_get_fd(dstbuf[0]);
    fddst[1] = mpp_buffer_get_fd(dstbuf[1]);

    iep2->ops->init(&iep2->priv);

    if (srcfrmsize > fread(psrc[0], 1, srcfrmsize, cfg->fp_src)) {
        mpp_log("source exhaused\n");
        goto ret;
    }

    if (srcfrmsize > fread(psrc[1], 1, srcfrmsize, cfg->fp_src)) {
        mpp_log("source exhaused\n");
        goto ret;
    }

    curr = 1;

    // set running mode.
    /* if deinterlacing mode is one in the following list:
        IEP2_DIL_MODE_I5O2,
        IEP2_DIL_MODE_I5O1T,
        IEP2_DIL_MODE_I5O1B,
        IEP2_DIL_MODE_DECT
       field order will auto detect by iep2 library.
       so don't try to set field order during the playback.
    */
    params.ptype = IEP2_PARAM_TYPE_MODE;
    params.param.mode.dil_mode = IEP2_DIL_MODE_I5O2;
    params.param.mode.out_mode = IEP2_OUT_MODE_LINE;
    params.param.mode.dil_order = cfg->field_order;

    iep2->ops->control(iep2->priv, IEP_CMD_SET_DEI_CFG, &params);

    // set the image format.
    params.ptype = IEP2_PARAM_TYPE_COM;
    params.param.com.sfmt = cfg->src_fmt;
    params.param.com.dfmt = cfg->dst_fmt;
    params.param.com.sswap = cfg->src_swa;
    params.param.com.dswap = cfg->dst_swa;
    params.param.com.width = cfg->w;
    params.param.com.height = cfg->h;
    params.param.com.hor_stride = cfg->w;
    iep2->ops->control(iep2->priv, IEP_CMD_SET_DEI_CFG, &params);

    for (i = 0; i < MPP_ARRAY_ELEMS(imgsrc); i++)
        imgsrc[i].format = cfg->src_fmt;

    for (i = 0; i < MPP_ARRAY_ELEMS(imgdst); i++)
        imgdst[i].format = cfg->dst_fmt;

    while (1) {
        prev = (curr - 1) % 3;
        curr = curr % 3;
        next = (curr + 1) % 3;

        if (srcfrmsize > fread(psrc[next], 1, srcfrmsize, cfg->fp_src)) {
            mpp_log("source exhaused\n");
            break;
        }

        // notice the order of the input frames.
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgsrc[curr], fdsrc[curr], IEP_CMD_SET_SRC);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgsrc[next], fdsrc[next], IEP_CMD_SET_DEI_SRC1);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgsrc[prev], fdsrc[prev], IEP_CMD_SET_DEI_SRC2);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgdst[0], fddst[0], IEP_CMD_SET_DST);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgdst[1], fddst[1], IEP_CMD_SET_DEI_DST1);

        memset(pdst[0], 0, dstfrmsize);
        memset(pdst[1], 0, dstfrmsize);
        iep2->ops->control(iep2->priv, IEP_CMD_RUN_SYNC, &dei_info);

        if (cfg->fp_slt) {
            calc_data_crc(pdst[out_order], dstfrmsize, &checkcrc);
            write_data_crc(cfg->fp_slt, &checkcrc);
            calc_data_crc(pdst[1 - out_order], dstfrmsize, &checkcrc);
            write_data_crc(cfg->fp_slt, &checkcrc);
        }

        out_order = dei_info.dil_order == IEP2_FIELD_ORDER_BFF ? 1 : 0;

        if (cfg->fp_dst) {
            if (dstfrmsize > fwrite(pdst[out_order], 1, dstfrmsize, cfg->fp_dst)) {
                mpp_err("destination dump failed\n");
                break;
            }

            if (dstfrmsize > fwrite(pdst[1 - out_order], 1, dstfrmsize, cfg->fp_dst)) {
                mpp_err("destination dump failed\n");
                break;
            }
        }

        curr++;
    }

ret:
    mpp_buffer_put(srcbuf[0]);
    mpp_buffer_put(srcbuf[1]);
    mpp_buffer_put(srcbuf[2]);

    mpp_buffer_put(dstbuf[0]);
    mpp_buffer_put(dstbuf[1]);

    MPP_FREE(checkcrc.sum);

    if (memGroup) {
        mpp_buffer_group_put(memGroup);
        memGroup = NULL;
    }

    iep2->ops->deinit(iep2->priv);

    rockchip_iep2_api_release_ctx(iep2);
}